

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O2

void sysbvm_jit_callWithContext1
               (sysbvm_bytecodeJit_t *jit,void *functionPointer,int16_t resultOperand,
               int16_t argumentOperand0)

{
  sysbvm_x86_register_t reg;
  
  sysbvm_jit_x86_jitLoadContextInRegister(jit,(sysbvm_x86_register_t)functionPointer);
  sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG1,argumentOperand0);
  sysbvm_jit_x86_call(jit,functionPointer);
  sysbvm_jit_moveRegisterToOperand(jit,resultOperand,reg);
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_callWithContext1(sysbvm_bytecodeJit_t *jit, void *functionPointer, int16_t resultOperand, int16_t argumentOperand0)
{
    sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);
    sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG1, argumentOperand0);
    sysbvm_jit_x86_call(jit, functionPointer);
    sysbvm_jit_moveRegisterToOperand(jit, resultOperand, SYSBVM_X86_RAX);
}